

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_storage_info.cpp
# Opt level: O1

void duckdb::PragmaStorageInfoFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  FunctionData *pFVar1;
  GlobalTableFunctionState *pGVar2;
  pointer pcVar3;
  int64_t *piVar4;
  const_reference pvVar5;
  long lVar6;
  ColumnDefinition *this;
  string *psVar7;
  idx_t iVar8;
  int64_t *piVar9;
  _func_int **__n;
  ulong index;
  bool bVar10;
  vector<duckdb::Value,_true> blocks;
  Value local_208;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_1c8;
  FunctionData *local_1a8;
  vector<duckdb::ColumnSegmentInfo,_true> *local_1a0;
  ColumnList *local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_88 [24];
  Value local_70;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  local_198 = TableCatalogEntry::GetColumns((TableCatalogEntry *)pFVar1[4]._vptr_FunctionData);
  __n = pGVar2[1]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pFVar1[6]._vptr_FunctionData - (long)pFVar1[5]._vptr_FunctionData >> 3) *
            -0x1084210842108421)) {
    local_1a0 = (vector<duckdb::ColumnSegmentInfo,_true> *)(pFVar1 + 5);
    index = 0;
    local_1a8 = pFVar1;
    do {
      pGVar2[1]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar5 = vector<duckdb::ColumnSegmentInfo,_true>::operator[](local_1a0,(size_type)__n);
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar5->row_group_index);
      Value::BIGINT(&local_208,lVar6);
      DataChunk::SetValue(output,0,index,&local_208);
      Value::~Value(&local_208);
      this = ColumnList::GetColumn(local_198,(PhysicalIndex)pvVar5->column_id);
      psVar7 = ColumnDefinition::Name_abi_cxx11_(this);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar3 = (psVar7->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar3,pcVar3 + psVar7->_M_string_length);
      Value::Value(&local_208,&local_f0);
      DataChunk::SetValue(output,1,index,&local_208);
      Value::~Value(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar5->column_id);
      Value::BIGINT(&local_208,lVar6);
      DataChunk::SetValue(output,2,index,&local_208);
      Value::~Value(&local_208);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar3 = (pvVar5->column_path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (pvVar5->column_path)._M_string_length);
      Value::Value(&local_208,&local_110);
      DataChunk::SetValue(output,3,index,&local_208);
      Value::~Value(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar5->segment_idx);
      Value::BIGINT(&local_208,lVar6);
      DataChunk::SetValue(output,4,index,&local_208);
      Value::~Value(&local_208);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar3 = (pvVar5->segment_type)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + (pvVar5->segment_type)._M_string_length);
      Value::Value(&local_208,&local_130);
      DataChunk::SetValue(output,5,index,&local_208);
      Value::~Value(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar5->segment_start);
      Value::BIGINT(&local_208,lVar6);
      DataChunk::SetValue(output,6,index,&local_208);
      Value::~Value(&local_208);
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar5->segment_count);
      Value::BIGINT(&local_208,lVar6);
      DataChunk::SetValue(output,7,index,&local_208);
      Value::~Value(&local_208);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      pcVar3 = (pvVar5->compression_type)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar3,pcVar3 + (pvVar5->compression_type)._M_string_length);
      Value::Value(&local_208,&local_150);
      DataChunk::SetValue(output,8,index,&local_208);
      Value::~Value(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      pcVar3 = (pvVar5->segment_stats)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (pvVar5->segment_stats)._M_string_length);
      Value::Value(&local_208,&local_170);
      DataChunk::SetValue(output,9,index,&local_208);
      Value::~Value(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      Value::BOOLEAN(&local_208,pvVar5->has_updates);
      DataChunk::SetValue(output,10,index,&local_208);
      Value::~Value(&local_208);
      Value::BOOLEAN(&local_208,pvVar5->persistent);
      DataChunk::SetValue(output,0xb,index,&local_208);
      Value::~Value(&local_208);
      if (pvVar5->persistent == true) {
        Value::BIGINT(&local_208,pvVar5->block_id);
        DataChunk::SetValue(output,0xc,index,&local_208);
        Value::~Value(&local_208);
        lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar5->block_offset);
        Value::BIGINT(&local_208,lVar6);
        DataChunk::SetValue(output,0xd,index,&local_208);
        Value::~Value(&local_208);
      }
      else {
        LogicalType::LogicalType(&local_a0,SQLNULL);
        Value::Value(&local_208,&local_a0);
        DataChunk::SetValue(output,0xc,index,&local_208);
        Value::~Value(&local_208);
        LogicalType::~LogicalType(&local_a0);
        LogicalType::LogicalType(&local_b8,SQLNULL);
        Value::Value(&local_208,&local_b8);
        DataChunk::SetValue(output,0xd,index,&local_208);
        Value::~Value(&local_208);
        LogicalType::~LogicalType(&local_b8);
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      pcVar3 = (pvVar5->segment_info)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar3,pcVar3 + (pvVar5->segment_info)._M_string_length);
      Value::Value(&local_208,&local_190);
      DataChunk::SetValue(output,0xe,index,&local_208);
      Value::~Value(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if (pvVar5->persistent == true) {
        local_1c8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        piVar4 = (pvVar5->additional_blocks).super_vector<long,_std::allocator<long>_>.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar9 = (pvVar5->additional_blocks).super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar9 != piVar4; piVar9 = piVar9 + 1) {
          Value::BIGINT(&local_208,*piVar9);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,&local_208)
          ;
          Value::~Value(&local_208);
        }
        LogicalType::LogicalType(&local_208.type_,BIGINT);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(local_88,&local_1c8);
        Value::LIST(&local_70,&local_208.type_,(vector<duckdb::Value,_true> *)local_88);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_88);
        LogicalType::~LogicalType(&local_208.type_);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8);
        DataChunk::SetValue(output,0xf,index,&local_70);
        Value::~Value(&local_70);
      }
      else {
        LogicalType::LogicalType(&local_d0,SQLNULL);
        Value::Value(&local_208,&local_d0);
        DataChunk::SetValue(output,0xf,index,&local_208);
        Value::~Value(&local_208);
        LogicalType::~LogicalType(&local_d0);
      }
      iVar8 = index + 1;
      __n = pGVar2[1]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)local_1a8[6]._vptr_FunctionData - (long)local_1a8[5]._vptr_FunctionData
                     >> 3) * -0x1084210842108421)) &&
            (bVar10 = index < 0x7ff, index = iVar8, bVar10));
  }
  else {
    iVar8 = 0;
  }
  output->count = iVar8;
  return;
}

Assistant:

static void PragmaStorageInfoFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<PragmaStorageFunctionData>();
	auto &data = data_p.global_state->Cast<PragmaStorageOperatorData>();
	idx_t count = 0;
	auto &columns = bind_data.table_entry.GetColumns();
	while (data.offset < bind_data.column_segments_info.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = bind_data.column_segments_info[data.offset++];

		idx_t col_idx = 0;
		// row_group_id
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.row_group_index)));
		// column_name
		auto &col = columns.GetColumn(PhysicalIndex(entry.column_id));
		output.SetValue(col_idx++, count, Value(col.Name()));
		// column_id
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.column_id)));
		// column_path
		output.SetValue(col_idx++, count, Value(entry.column_path));
		// segment_id
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.segment_idx)));
		// segment_type
		output.SetValue(col_idx++, count, Value(entry.segment_type));
		// start
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.segment_start)));
		// count
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.segment_count)));
		// compression
		output.SetValue(col_idx++, count, Value(entry.compression_type));
		// stats
		output.SetValue(col_idx++, count, Value(entry.segment_stats));
		// has_updates
		output.SetValue(col_idx++, count, Value::BOOLEAN(entry.has_updates));
		// persistent
		output.SetValue(col_idx++, count, Value::BOOLEAN(entry.persistent));
		// block_id
		// block_offset
		if (entry.persistent) {
			output.SetValue(col_idx++, count, Value::BIGINT(entry.block_id));
			output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.block_offset)));
		} else {
			output.SetValue(col_idx++, count, Value());
			output.SetValue(col_idx++, count, Value());
		}
		// segment_info
		output.SetValue(col_idx++, count, Value(entry.segment_info));
		// additional_block_ids
		if (entry.persistent) {
			output.SetValue(col_idx++, count, ValueFromBlockIdList(entry.additional_blocks));
		} else {
			output.SetValue(col_idx++, count, Value());
		}
		count++;
	}
	output.SetCardinality(count);
}